

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.hpp
# Opt level: O2

double * __thiscall eos::core::Image<double>::operator()(Image<double> *this,int y,int x)

{
  uint __line;
  double *pdVar1;
  char *__assertion;
  
  if ((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __assertion = "data_.size() > 0";
    __line = 0x47;
  }
  else if ((y < 0) || (this->height_ <= y)) {
    __assertion = "y >= 0 && y < height_";
    __line = 0x49;
  }
  else {
    if ((-1 < x) && (x < this->width_)) {
      pdVar1 = (double *)byte_ptr(this,y,x);
      return pdVar1;
    }
    __assertion = "x >= 0 && x < width_";
    __line = 0x4a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                ,__line,
                "PixelType &eos::core::Image<double>::operator()(int, int) [PixelType = double]");
}

Assistant:

PixelType& operator()(int y, int x) noexcept
    {
        assert(data_.size() > 0); // byte_ptr() checks this but let's put the assert here too, because this
                                  // function is public-facing.
        assert(y >= 0 && y < height_);
        assert(x >= 0 && x < width_);
        return *data(y, x);
    }